

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadTransform(int *xsize,int *ysize,VP8LDecoder *dec)

{
  int iVar1;
  VP8LImageTransformType VVar2;
  uint32_t uVar3;
  int iVar4;
  VP8StatusCode VVar5;
  VP8LDecoder *in_RDX;
  uint32_t **in_RSI;
  VP8LDecoder *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int bits;
  int num_colors;
  VP8LImageTransformType type;
  VP8LTransform *transform;
  VP8LBitReader *br;
  int ok;
  uint32_t local_54;
  uint32_t local_50;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  VP8LTransform *transform_00;
  int local_24;
  int in_stack_fffffffffffffffc;
  
  local_24 = 1;
  iVar1 = (int)in_RDX + 0x28;
  transform_00 = in_RDX->transforms + in_RDX->next_transform;
  VVar2 = VP8LReadBits((VP8LBitReader *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb4);
  if ((in_RDX->transforms_seen & 1 << ((byte)VVar2 & 0x1f)) == 0) {
    in_RDX->transforms_seen = in_RDX->transforms_seen | 1 << (VVar2 & 0x1f);
    transform_00->type = VVar2;
    transform_00->xsize = in_RDI->status;
    transform_00->ysize = *(int *)in_RSI;
    transform_00->data = (uint32_t *)0x0;
    in_RDX->next_transform = in_RDX->next_transform + 1;
    if (VVar2 < SUBTRACT_GREEN_TRANSFORM) {
      uVar3 = VP8LReadBits((VP8LBitReader *)CONCAT44(in_stack_ffffffffffffffbc,VVar2),
                           in_stack_ffffffffffffffb4);
      transform_00->bits = uVar3 + 2;
      VP8LSubSampleSize(transform_00->xsize,transform_00->bits);
      VP8LSubSampleSize(transform_00->ysize,transform_00->bits);
      local_24 = DecodeImageStream(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,
                                   in_RSI);
    }
    else if ((VVar2 != SUBTRACT_GREEN_TRANSFORM) && (VVar2 == COLOR_INDEXING_TRANSFORM)) {
      uVar3 = VP8LReadBits((VP8LBitReader *)CONCAT44(in_stack_ffffffffffffffbc,3),
                           in_stack_ffffffffffffffb4);
      iVar4 = uVar3 + 1;
      if (iVar4 < 0x11) {
        if (iVar4 < 5) {
          local_54 = 3;
          if (2 < iVar4) {
            local_54 = 2;
          }
        }
        else {
          local_54 = 1;
        }
        local_50 = local_54;
      }
      else {
        local_50 = 0;
      }
      VVar5 = VP8LSubSampleSize(transform_00->xsize,local_50);
      in_RDI->status = VVar5;
      transform_00->bits = local_50;
      local_24 = DecodeImageStream(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,
                                   in_RSI);
      if ((local_24 != 0) && (iVar1 = ExpandColorMap(iVar1,transform_00), iVar1 == 0)) {
        local_24 = VP8LSetError(in_RDX,VP8_STATUS_OUT_OF_MEMORY);
      }
    }
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int ReadTransform(int* const xsize, int const* ysize,
                         VP8LDecoder* const dec) {
  int ok = 1;
  VP8LBitReader* const br = &dec->br;
  VP8LTransform* transform = &dec->transforms[dec->next_transform];
  const VP8LImageTransformType type =
      (VP8LImageTransformType)VP8LReadBits(br, 2);

  // Each transform type can only be present once in the stream.
  if (dec->transforms_seen & (1U << type)) {
    return 0;  // Already there, let's not accept the second same transform.
  }
  dec->transforms_seen |= (1U << type);

  transform->type = type;
  transform->xsize = *xsize;
  transform->ysize = *ysize;
  transform->data = NULL;
  ++dec->next_transform;
  assert(dec->next_transform <= NUM_TRANSFORMS);

  switch (type) {
    case PREDICTOR_TRANSFORM:
    case CROSS_COLOR_TRANSFORM:
      transform->bits =
          MIN_TRANSFORM_BITS + VP8LReadBits(br, NUM_TRANSFORM_BITS);
      ok = DecodeImageStream(VP8LSubSampleSize(transform->xsize,
                                               transform->bits),
                             VP8LSubSampleSize(transform->ysize,
                                               transform->bits),
                             /*is_level0=*/0, dec, &transform->data);
      break;
    case COLOR_INDEXING_TRANSFORM: {
       const int num_colors = VP8LReadBits(br, 8) + 1;
       const int bits = (num_colors > 16) ? 0
                      : (num_colors > 4) ? 1
                      : (num_colors > 2) ? 2
                      : 3;
       *xsize = VP8LSubSampleSize(transform->xsize, bits);
       transform->bits = bits;
       ok = DecodeImageStream(num_colors, /*ysize=*/1, /*is_level0=*/0, dec,
                              &transform->data);
       if (ok && !ExpandColorMap(num_colors, transform)) {
         return VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
       }
      break;
    }
    case SUBTRACT_GREEN_TRANSFORM:
      break;
    default:
      assert(0);    // can't happen
      break;
  }

  return ok;
}